

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cpp
# Opt level: O0

int __thiscall Control::timeToActivate(Control *this,Network *network,int t,int tod)

{
  bool bVar1;
  int local_38;
  int aTime;
  bool makeChange;
  Tank *tank;
  int tod_local;
  int t_local;
  Network *network_local;
  Control *this_local;
  
  local_38 = -1;
  switch(*(undefined4 *)&(this->super_Element).field_0x2c) {
  case 0:
    local_38 = Tank::timeToVolume((Tank *)this->node,this->volume);
    break;
  case 1:
    break;
  case 2:
    local_38 = this->time - t;
    break;
  case 3:
    if (this->time < tod) {
      local_38 = (0x15180 - tod) + this->time;
    }
    else {
      local_38 = this->time - tod;
    }
  }
  if ((local_38 < 1) || (bVar1 = activate(this,false,(ostream *)&network->msgLog), !bVar1)) {
    this_local._4_4_ = -1;
  }
  else {
    this_local._4_4_ = local_38;
  }
  return this_local._4_4_;
}

Assistant:

int Control::timeToActivate(Network* network, int t, int tod)
{
    Tank* tank;
    bool makeChange = false; //do not implement any control actions
    int  aTime = -1;
    switch (type)
    {
    case PRESSURE_LEVEL: break;

    case TANK_LEVEL:
        tank = static_cast<Tank*>(node);
        aTime = tank->timeToVolume(volume);
        break;

    case ELAPSED_TIME:
        aTime = time - t;
        break;

    case TIME_OF_DAY:
        if (time >= tod) aTime = time - tod;
        else aTime = 86400 - tod + time;
        break;
    }

    if ( aTime > 0 && activate(makeChange, network->msgLog) ) return aTime;
    else return -1;
}